

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::GetPropertyIdFromSymbolAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  Var aValue;
  RecyclableObject *value;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)49>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
  if ((ulong)aValue >> 0x30 == 0 && aValue != (Var)0x0) {
    value = Js::VarTo<Js::RecyclableObject>(aValue);
    if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
        ptr != scriptContext) {
      Js::CrossSite::MarshalVar(scriptContext,value,false);
      return;
    }
  }
  return;
}

Assistant:

void GetPropertyIdFromSymbolAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetPropertyIdFromSymbolTag>(evt);
            Js::Var sym = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(sym, ctx);

            //These really don't have any effect, we need the marshal in validate, so just skip since Js::JavascriptSymbol has strange declaration order
            //
            //if(!Js::VarIs<Js::JavascriptSymbol>(sym))
            //{
            //    return JsErrorPropertyNotSymbol;
            //}
            //
            //Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        }